

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          String *params)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint hash;
  uint uVar6;
  long lVar7;
  size_t in_RDX;
  char *pcVar8;
  StringHasher *this_00;
  size_t in_R8;
  ulong uVar9;
  StringPtr str;
  StringPtr a;
  StringPtr b;
  
  if (*(long *)(this + 0x38) == 0) {
    return (Maybe<kj::StringPtr_&>)(StringPtr *)0x0;
  }
  sVar2 = (params->content).size_;
  this_00 = (StringHasher *)0x19e242;
  if (sVar2 != 0) {
    this_00 = (StringHasher *)(params->content).ptr;
  }
  lVar3 = *(long *)this;
  str.content.ptr = (char *)(sVar2 + (sVar2 == 0));
  str.content.size_ = in_RDX;
  hash = _::anon_unknown_0::StringHasher::hashCode(this_00,str);
  uVar6 = _::chooseBucket(hash,*(uint *)(this + 0x38));
  do {
    uVar9 = (ulong)uVar6;
    lVar4 = *(long *)(this + 0x30);
    iVar1 = *(int *)(lVar4 + 4 + uVar9 * 8);
    if (iVar1 == 0) {
      return (Maybe<kj::StringPtr_&>)(StringPtr *)0x0;
    }
    if ((iVar1 != 1) && (*(uint *)(lVar4 + uVar9 * 8) == hash)) {
      sVar2 = (params->content).size_;
      pcVar8 = "";
      if (sVar2 != 0) {
        pcVar8 = (params->content).ptr;
      }
      lVar7 = (ulong)(iVar1 - 2) * 0x10;
      b.content.ptr = (char *)(sVar2 + (sVar2 == 0));
      a.content.size_ = (size_t)pcVar8;
      a.content.ptr = *(char **)(lVar3 + 8 + lVar7);
      b.content.size_ = in_R8;
      bVar5 = _::anon_unknown_0::StringHasher::matches(*(StringHasher **)(lVar3 + lVar7),a,b);
      if (bVar5) {
        return (Maybe<kj::StringPtr_&>)
               (StringPtr *)((ulong)(*(int *)(lVar4 + 4 + uVar9 * 8) - 2) * 0x10 + *(long *)this);
      }
    }
    uVar6 = 0;
    if (uVar9 + 1 != *(long *)(this + 0x38)) {
      uVar6 = (uint)(uVar9 + 1);
    }
  } while( true );
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }